

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * cppcms::util::md5hex(string *__return_storage_ptr__,string *in)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  char buf [33];
  uchar data [16];
  md5_state_t state;
  char local_b8 [48];
  byte local_88 [24];
  md5_state_t local_70;
  
  impl::md5_init(&local_70);
  impl::md5_append(&local_70,(md5_byte_t *)(in->_M_dataplus)._M_p,(int)in->_M_string_length);
  impl::md5_finish(&local_70,local_88);
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0x1e] = '\0';
  local_b8[0x1f] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  lVar2 = 0;
  do {
    bVar1 = local_88[lVar2];
    local_b8[lVar2 * 2] = "0123456789abcdef"[bVar1 >> 4];
    local_b8[lVar2 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  local_b8[0x20] = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_b8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_b8,local_b8 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string md5hex(std::string const &in)
{
	using namespace cppcms::impl;
	unsigned char data[16];
	md5_state_t state;
	md5_init(&state);
	md5_append(&state,reinterpret_cast<unsigned const char *>(in.c_str()),in.size());
	md5_finish(&state,data);
	char buf[33]={0};
	impl::tohex(data,sizeof(data),buf);
	return buf;
}